

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiWindow *potential_parent;
  bool bVar4;
  bool mouse_dragging_extern_payload;
  bool mouse_avail_to_imgui;
  int i;
  bool mouse_any_down;
  int mouse_earliest_button_down;
  ImGuiWindow *modal_window;
  bool clear_hovered_windows;
  ImGuiContext *g;
  bool local_2c;
  bool local_2b;
  bool local_2a;
  byte local_28;
  bool local_27;
  int local_24;
  int local_1c;
  
  pIVar2 = GImGui;
  bVar1 = false;
  FindHoveredWindow();
  potential_parent = GetTopMostPopupModal();
  if (((potential_parent != (ImGuiWindow *)0x0) && (pIVar2->HoveredRootWindow != (ImGuiWindow *)0x0)
      ) && (bVar3 = IsWindowChildOf(pIVar2->HoveredRootWindow,potential_parent), !bVar3)) {
    bVar1 = true;
  }
  if (((pIVar2->IO).ConfigFlags & 0x10U) != 0) {
    bVar1 = true;
  }
  local_1c = -1;
  bVar3 = false;
  for (local_24 = 0; local_24 < 5; local_24 = local_24 + 1) {
    if (((pIVar2->IO).MouseClicked[local_24] & 1U) != 0) {
      local_27 = true;
      if (pIVar2->HoveredWindow == (ImGuiWindow *)0x0) {
        local_27 = 0 < (pIVar2->OpenPopupStack).Size;
      }
      (pIVar2->IO).MouseDownOwned[local_24] = local_27;
    }
    bVar3 = bVar3 || ((pIVar2->IO).MouseDown[local_24] & 1U) != 0;
    if ((((pIVar2->IO).MouseDown[local_24] & 1U) != 0) &&
       ((local_1c == -1 ||
        ((pIVar2->IO).MouseClickedTime[local_24] < (pIVar2->IO).MouseClickedTime[local_1c])))) {
      local_1c = local_24;
    }
  }
  local_28 = 1;
  if (local_1c != -1) {
    local_28 = (pIVar2->IO).MouseDownOwned[local_1c];
  }
  bVar4 = false;
  if ((pIVar2->DragDropActive & 1U) != 0) {
    bVar4 = (pIVar2->DragDropSourceFlags & 0x10U) != 0;
  }
  if (((local_28 & 1) == 0) && (!bVar4)) {
    bVar1 = true;
  }
  if (bVar1) {
    pIVar2->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
    pIVar2->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar2->HoveredWindow = (ImGuiWindow *)0x0;
  }
  if (pIVar2->WantCaptureMouseNextFrame == -1) {
    if (((local_28 & 1) == 0) ||
       ((local_2a = true, pIVar2->HoveredWindow == (ImGuiWindow *)0x0 && (local_2a = true, !bVar3)))
       ) {
      local_2a = 0 < (pIVar2->OpenPopupStack).Size;
    }
    (pIVar2->IO).WantCaptureMouse = local_2a;
  }
  else {
    (pIVar2->IO).WantCaptureMouse = pIVar2->WantCaptureMouseNextFrame != 0;
  }
  if (pIVar2->WantCaptureKeyboardNextFrame == -1) {
    local_2b = pIVar2->ActiveId != 0 || potential_parent != (ImGuiWindow *)0x0;
    (pIVar2->IO).WantCaptureKeyboard = local_2b;
  }
  else {
    (pIVar2->IO).WantCaptureKeyboard = pIVar2->WantCaptureKeyboardNextFrame != 0;
  }
  if (((((pIVar2->IO).NavActive & 1U) != 0) && (((pIVar2->IO).ConfigFlags & 1U) != 0)) &&
     (((pIVar2->IO).ConfigFlags & 8U) == 0)) {
    (pIVar2->IO).WantCaptureKeyboard = true;
  }
  if (pIVar2->WantTextInputNextFrame == -1) {
    local_2c = false;
  }
  else {
    local_2c = pIVar2->WantTextInputNextFrame != 0;
  }
  (pIVar2->IO).WantTextInput = local_2c;
  return;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    bool clear_hovered_windows = false;
    FindHoveredWindow();

    // Modal windows prevents mouse from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window && g.HoveredRootWindow && !IsWindowChildOf(g.HoveredRootWindow, modal_window))
        clear_hovered_windows = true;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        clear_hovered_windows = true;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (g.OpenPopupStack.Size > 0);
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        clear_hovered_windows = true;

    if (clear_hovered_windows)
        g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to Dear ImGui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (g.OpenPopupStack.Size > 0);

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to Dear ImGui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}